

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall args::Group::~Group(Group *this)

{
  Group *this_local;
  
  ~Group(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~Group() {}